

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.cpp
# Opt level: O0

string * __thiscall pbrt::Triangle::ToString_abi_cxx11_(Triangle *this)

{
  TriangleMesh *args_1;
  int *in_RSI;
  string *in_RDI;
  Point3<float> *in_stack_00000010;
  Point3f *p2;
  Point3f *p1;
  Point3f *p0;
  int *v;
  TriangleMesh *mesh;
  int *args;
  string *fmt;
  
  args = in_RSI;
  fmt = in_RDI;
  args_1 = GetMesh((Triangle *)0x45e10a);
  StringPrintf<int_const&,int_const&,pbrt::Point3<float>const&,pbrt::Point3<float>const&,pbrt::Point3<float>const&>
            ((char *)fmt,args,&args_1->nTriangles,
             (Point3<float> *)(args_1->vertexIndices + in_RSI[1] * 3),
             args_1->p +
             (int)(((Point3<float> *)(args_1->vertexIndices + in_RSI[1] * 3))->
                  super_Tuple3<pbrt::Point3,_float>).x,in_stack_00000010);
  return in_RDI;
}

Assistant:

std::string Triangle::ToString() const {
    // Get triangle vertices in _p0_, _p1_, and _p2_
    auto mesh = GetMesh();
    const int *v = &mesh->vertexIndices[3 * triIndex];
    const Point3f &p0 = mesh->p[v[0]];
    const Point3f &p1 = mesh->p[v[1]];
    const Point3f &p2 = mesh->p[v[2]];

    return StringPrintf("[ Triangle meshIndex: %d triIndex: %d -> p [ %s %s %s ] ]",
                        meshIndex, triIndex, p0, p1, p2);
}